

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromVertex(ON_SubDVertex *v)

{
  ON_SubD_ComponentIdTypeAndTag OVar1;
  
  if (v != (ON_SubDVertex *)0x0) {
    OVar1 = CreateFromVertexId((v->super_ON_SubDComponentBase).m_id,v->m_vertex_tag);
    return OVar1;
  }
  return (ON_SubD_ComponentIdTypeAndTag)ZEXT816((ulong)(float  [2])0x0);
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromVertex(const ON_SubDVertex* v)
{
  ON_SubD_ComponentIdTypeAndTag itt
    = (nullptr != v)
    ? ON_SubD_ComponentIdTypeAndTag::CreateFromVertexId(v->m_id, v->m_vertex_tag)
    : ON_SubD_ComponentIdTypeAndTag::Unset;
  //if (itt.m_id > 0)
  //  itt.m_cptr = ON_SubDComponentPtr::Create(v);
  return itt;
}